

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O2

void tcmalloc::ThreadCache::GetThreadStats(uint64_t *total_bytes,uint64_t *class_count)

{
  long lVar1;
  long *plVar2;
  int *piVar3;
  ulong uVar4;
  
  plVar2 = &thread_heaps_;
  while (lVar1 = *plVar2, lVar1 != 0) {
    *total_bytes = *total_bytes + (long)*(int *)(lVar1 + 0x1000);
    if (class_count != (uint64_t *)0x0) {
      piVar3 = (int *)(lVar1 + 8);
      for (uVar4 = 0; uVar4 < DAT_00158b10; uVar4 = uVar4 + 1) {
        class_count[uVar4] = class_count[uVar4] + (long)*piVar3;
        piVar3 = piVar3 + 8;
      }
    }
    plVar2 = (long *)(lVar1 + 0x1020);
  }
  return;
}

Assistant:

void ThreadCache::GetThreadStats(uint64_t* total_bytes, uint64_t* class_count) {
  for (ThreadCache* h = thread_heaps_; h != nullptr; h = h->next_) {
    *total_bytes += h->Size();
    if (class_count) {
      for (int cl = 0; cl < Static::num_size_classes(); ++cl) {
        class_count[cl] += h->freelist_length(cl);
      }
    }
  }
}